

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::fastcgi::on_some_read_from_socket
          (fastcgi *this,error_code *e,size_t read_size,
          callback<void_(const_std::error_code_&,_unsigned_long)> *cb,
          pair<void_*,_unsigned_long> inp)

{
  this->cache_end_ = this->cache_end_ + read_size;
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(cb,e,0);
    return;
  }
  async_read_from_socket(this,inp.first,inp.second,cb);
  return;
}

Assistant:

void on_some_read_from_socket(	booster::system::error_code const &e,
						size_t read_size, 
						booster::callback<void(booster::system::error_code const &e,size_t read)> const &cb,
						std::pair<void *,size_t> inp)
		{
			void *ptr = inp.first;
			size_t expected_read_size = inp.second;
			cache_end_ += read_size;
			if(e) {
				cb(e,0);
				return;
			}
			async_read_from_socket(ptr,expected_read_size,cb);
		}